

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O2

void pzshape::TPZShapeLinear::Expo(REAL x,int num,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  double local_48;
  double local_40;
  REAL x_local;
  
  if (0 < num) {
    local_48 = 1.0;
    x_local = x;
    (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (phi,0,0,&local_48);
    local_48 = 0.0;
    (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (dphi,0,0,&local_48);
    if (num != 1) {
      (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (phi,1,0,&x_local);
      local_48 = 1.0;
      (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (dphi,0,1,&local_48);
      lVar2 = (ulong)(uint)num - 2;
      lVar3 = 2;
      while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
        local_40 = x_local;
        pdVar1 = TPZFMatrix<double>::operator()(phi,lVar3 + -1,0);
        local_48 = local_40 * *pdVar1;
        (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20]
        )(phi,lVar3,0,&local_48);
        local_40 = (double)(int)lVar3;
        pdVar1 = TPZFMatrix<double>::operator()(phi,lVar3 + -1,0);
        local_48 = local_40 * *pdVar1;
        (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x20])(dphi,0,lVar3,&local_48);
        lVar3 = lVar3 + 1;
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Expo(REAL x,int num,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi){
        // Quadratic or higher shape functions
        if(num <= 0) return;
        phi.Put(0,0,1.0);
        dphi.Put(0,0, 0.0);
        if(num == 1) return;
        phi.Put(1,0, x);
        dphi.Put(0,1, 1.0);
        int ord;
        for(ord = 2;ord<num;ord++) {
            phi.Put(ord,0, x*phi(ord-1,0));
            dphi.Put(0,ord, ord*phi(ord-1,0));
        }
    }